

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::JsBuiltInEngineInterfaceExtensionObject::
    EntryJsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  int n;
  CallFlags e;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  JavascriptArray *this_00;
  JavascriptLibrary *this_01;
  JavascriptBoolean *pJVar6;
  ScriptContext *in_R9;
  BigIndex index_00;
  Var item;
  BigIndex bigIndex;
  double index;
  RecyclableObject *obj;
  ScriptContext *scriptContext;
  uint argCount;
  undefined1 local_40 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args(callInfo);
  values = _get_va(&stack0x00000000,n);
  args.Values = (Type)callInfo;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,500,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  Arguments::Arguments((Arguments *)local_40,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,500,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar2 = (ulong)local_40 & 0xffffff;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  if (uVar2 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,500,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((local_40._0_4_ & 0xffffff) != 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x1f5,"(args.Info.Count == 4)","args.Info.Count == 4");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = (JavascriptArray *)VarTo<Js::RecyclableObject>(*(Var *)((long)args.Info + 8));
  bigIndex.bigIndex =
       (uint64)JavascriptConversion::ToInteger(*(Var *)((long)args.Info + 0x10),pSVar4);
  if ((double)bigIndex.bigIndex < 0.0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x1f9,"(index >= 0)","index >= 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  Js::JavascriptArray::BigIndex::BigIndex
            ((BigIndex *)&item,
             (long)(double)bigIndex.bigIndex |
             (long)((double)bigIndex.bigIndex - 9.223372036854776e+18) &
             (long)(double)bigIndex.bigIndex >> 0x3f);
  index_00.bigIndex = *(uint64 *)((long)args.Info + 0x18);
  index_00.index = bigIndex.index;
  index_00._4_4_ = bigIndex._4_4_;
  Js::JavascriptArray::CreateDataPropertyOrThrow
            (this_00,(RecyclableObject *)((ulong)item & 0xffffffff),index_00,pSVar4,in_R9);
  this_01 = ScriptContext::GetLibrary(pSVar4);
  pJVar6 = JavascriptLibraryBase::GetTrue(&this_01->super_JavascriptLibraryBase);
  return pJVar6;
}

Assistant:

Var JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow(RecyclableObject *function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        AssertOrFailFast(args.Info.Count == 4);

        RecyclableObject * obj = VarTo<RecyclableObject>(args.Values[1]);
        double index = JavascriptConversion::ToInteger(args.Values[2], scriptContext);
        AssertOrFailFast(index >= 0);
        JavascriptArray::BigIndex bigIndex(static_cast<uint64>(index));
        Var item = args.Values[3];

        JavascriptArray::CreateDataPropertyOrThrow(obj, bigIndex, item, scriptContext);
        return scriptContext->GetLibrary()->GetTrue();
    }